

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall mkvparser::Chapters::Parse(Chapters *this)

{
  long lVar1;
  long status;
  longlong size;
  longlong id;
  longlong stop;
  longlong pos;
  IMkvReader *pReader;
  Chapters *this_local;
  
  pos = (longlong)this->m_pSegment->m_pReader;
  stop = this->m_start;
  id = stop + this->m_size;
  pReader = (IMkvReader *)this;
  while( true ) {
    if (id <= stop) {
      if (stop != id) {
        return -2;
      }
      return 0;
    }
    lVar1 = ParseElementHeader((IMkvReader *)pos,&stop,id,&size,&status);
    if (lVar1 < 0) break;
    if (status != 0) {
      if ((size == 0x45b9) && (lVar1 = ParseEdition(this,stop,status), lVar1 < 0)) {
        return lVar1;
      }
      stop = status + stop;
      if (id < stop) {
        return -2;
      }
    }
  }
  return lVar1;
}

Assistant:

long Chapters::Parse() {
  IMkvReader* const pReader = m_pSegment->m_pReader;

  long long pos = m_start;  // payload start
  const long long stop = pos + m_size;  // payload stop

  while (pos < stop) {
    long long id, size;

    long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (size == 0)  // weird
      continue;

    if (id == libwebm::kMkvEditionEntry) {
      status = ParseEdition(pos, size);

      if (status < 0)  // error
        return status;
    }

    pos += size;
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;
  return 0;
}